

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::MeanVarianceNormalizeLayerParams::MeanVarianceNormalizeLayerParams
          (MeanVarianceNormalizeLayerParams *this,MeanVarianceNormalizeLayerParams *from)

{
  ulong uVar1;
  bool bVar2;
  undefined2 uVar3;
  float fVar4;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__MeanVarianceNormalizeLayerParams_004b6800;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  bVar2 = from->normalizevariance_;
  uVar3 = *(undefined2 *)&from->field_0x12;
  fVar4 = from->epsilon_;
  this->acrosschannels_ = from->acrosschannels_;
  this->normalizevariance_ = bVar2;
  *(undefined2 *)&this->field_0x12 = uVar3;
  this->epsilon_ = fVar4;
  return;
}

Assistant:

MeanVarianceNormalizeLayerParams::MeanVarianceNormalizeLayerParams(const MeanVarianceNormalizeLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&acrosschannels_, &from.acrosschannels_,
    static_cast<size_t>(reinterpret_cast<char*>(&epsilon_) -
    reinterpret_cast<char*>(&acrosschannels_)) + sizeof(epsilon_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MeanVarianceNormalizeLayerParams)
}